

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateInterfaceProperty
          (cmExportFileGenerator *this,string *propName,string *outputName,cmGeneratorTarget *target
          ,PreprocessContext preprocessRule,ImportPropertyMap *properties)

{
  bool bVar1;
  ulong uVar2;
  string *input_00;
  mapped_type *this_00;
  undefined1 local_60 [8];
  string prepro;
  cmValue input;
  ImportPropertyMap *properties_local;
  PreprocessContext preprocessRule_local;
  cmGeneratorTarget *target_local;
  string *outputName_local;
  string *propName_local;
  cmExportFileGenerator *this_local;
  
  prepro.field_2._8_8_ = cmGeneratorTarget::GetProperty(target,propName);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&prepro.field_2 + 8));
  if (bVar1) {
    cmValue::operator->[abi_cxx11_((cmValue *)((long)&prepro.field_2 + 8));
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      input_00 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&prepro.field_2 + 8));
      cmGeneratorExpression::Preprocess((string *)local_60,input_00,preprocessRule,false);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        ResolveTargetsInGeneratorExpressions(this,(string *)local_60,target,NoReplaceFreeTargets);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](properties,outputName);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_60);
      }
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](properties,outputName);
      std::__cxx11::string::clear();
    }
  }
  return;
}

Assistant:

void cmExportFileGenerator::PopulateInterfaceProperty(
  const std::string& propName, const std::string& outputName,
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties)
{
  cmValue input = target->GetProperty(propName);
  if (input) {
    if (input->empty()) {
      // Set to empty
      properties[outputName].clear();
      return;
    }

    std::string prepro =
      cmGeneratorExpression::Preprocess(*input, preprocessRule);
    if (!prepro.empty()) {
      this->ResolveTargetsInGeneratorExpressions(prepro, target);
      properties[outputName] = prepro;
    }
  }
}